

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O1

void mouse_button_callback(GLFWwindow *self,int button,int action,int mod)

{
  void *pvVar1;
  long lVar2;
  ulong uVar3;
  
  pvVar1 = glfwGetWindowUserPointer(self);
  if (button == 1) {
    if (action == 1) {
      glfwSetInputMode(self,0x33001,0x34003);
      uVar3 = *(ulong *)((long)pvVar1 + 0x60);
    }
    else {
      glfwSetInputMode(self,0x33001,0x34001);
      uVar3 = *(ulong *)((long)pvVar1 + 0x60) ^ 0x8000000000000000;
    }
    lVar2 = 0x58;
  }
  else {
    if (button != 0) {
      return;
    }
    if (action == 1) {
      glfwSetCursor(self,*(GLFWcursor **)((long)pvVar1 + 8));
      uVar3 = *(ulong *)((long)pvVar1 + 0x60);
    }
    else {
      glfwSetCursor(self,(GLFWcursor *)0x0);
      uVar3 = *(ulong *)((long)pvVar1 + 0x60) ^ 0x8000000000000000;
    }
    lVar2 = 0x50;
  }
  *(ulong *)((long)pvVar1 + lVar2) = uVar3;
  return;
}

Assistant:

static void mouse_button_callback(GLFWwindow* self,
                                  int button, int action, int mod)
{
	bov_window_t* window = (bov_window_t*) glfwGetWindowUserPointer(self);

	if(button==GLFW_MOUSE_BUTTON_LEFT) {
		if(action==GLFW_PRESS){
			glfwSetCursor(self, window->leftClickCursor);
			window->clickTime[0] = window->wtime;
		}
		else {
			glfwSetCursor(self, NULL);
			window->clickTime[0] = -window->wtime;
		}
	}
	else if(button==GLFW_MOUSE_BUTTON_RIGHT) {
		if(action==GLFW_PRESS) {
			glfwSetInputMode(self, GLFW_CURSOR, GLFW_CURSOR_DISABLED);
			window->clickTime[1] = window->wtime;
		}
		else {
			glfwSetInputMode(self, GLFW_CURSOR, GLFW_CURSOR_NORMAL);
			window->clickTime[1] = -window->wtime;
		}
	}
}